

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O2

RasterFormatInfo * rw::d3d::findFormatInfoD3D(uint32 d3dformat)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    if (lVar2 + 0x10 == 0x2d0) {
      return &findFormatInfoD3D::fake;
    }
    lVar1 = lVar2 + 0x10;
  } while (*(uint32 *)((long)&formatInfoFull + lVar2) != d3dformat);
  return (RasterFormatInfo *)((long)&formatInfoFull + lVar2);
}

Assistant:

RasterFormatInfo*
findFormatInfoD3D(uint32 d3dformat)
{
	static RasterFormatInfo fake = { 0, 0, 0, 0 };
	int i;
	for(i = 0; i < (int)nelem(formatInfoFull); i++)
		if(formatInfoFull[i].d3dformat == d3dformat)
			return &formatInfoFull[i];
	return &fake;
}